

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EncodingCXX.cxx
# Opt level: O3

string * adios2sys::Encoding::ToNarrow(string *__return_storage_ptr__,wstring *str)

{
  pointer pwVar1;
  long lVar2;
  wchar_t *in_RDX;
  wchar_t *extraout_RDX;
  ulong uVar3;
  string local_50;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  uVar3 = 0;
  while( true ) {
    if ((uVar3 < str->_M_string_length) &&
       (pwVar1 = (str->_M_dataplus)._M_p, pwVar1[uVar3] != L'\0')) {
      ToNarrow_abi_cxx11_(&local_50,(Encoding *)(pwVar1 + uVar3),in_RDX);
      std::__cxx11::string::_M_append
                ((char *)__return_storage_ptr__,(ulong)local_50._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
    }
    lVar2 = std::__cxx11::wstring::find((wchar_t)str,0);
    if (lVar2 == -1) break;
    uVar3 = lVar2 + 1;
    std::__cxx11::string::push_back((char)__return_storage_ptr__);
    in_RDX = extraout_RDX;
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Encoding::ToNarrow(const std::wstring& str)
{
  std::string nstr;
#  if defined(_WIN32)
  int length =
    WideCharToMultiByte(KWSYS_ENCODING_DEFAULT_CODEPAGE, 0, str.c_str(),
                        int(str.size()), nullptr, 0, nullptr, nullptr);
  if (length > 0) {
    char* data = new char[length];
    int r =
      WideCharToMultiByte(KWSYS_ENCODING_DEFAULT_CODEPAGE, 0, str.c_str(),
                          int(str.size()), data, length, nullptr, nullptr);
    if (r > 0) {
      nstr = std::string(data, length);
    }
    delete[] data;
  }
#  else
  size_t pos = 0;
  size_t nullPos = 0;
  do {
    if (pos < str.size() && str.at(pos) != '\0') {
      nstr += ToNarrow(str.c_str() + pos);
    }
    nullPos = str.find(wchar_t('\0'), pos);
    if (nullPos != std::string::npos) {
      pos = nullPos + 1;
      nstr += '\0';
    }
  } while (nullPos != std::string::npos);
#  endif
  return nstr;
}